

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMsg * curl_multi_info_read(Curl_multi *multi,int *msgs_in_queue)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  Curl_llist *list;
  
  *msgs_in_queue = 0;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) && (multi->in_callback == false))
  {
    list = &multi->msglist;
    sVar3 = Curl_llist_count(list);
    if (sVar3 != 0) {
      pvVar1 = list->head->ptr;
      Curl_llist_remove(list,list->head,(void *)0x0);
      sVar3 = Curl_llist_count(list);
      iVar2 = curlx_uztosi(sVar3);
      *msgs_in_queue = iVar2;
      return (CURLMsg *)((long)pvVar1 + 0x18);
    }
  }
  return (CURLMsg *)0x0;
}

Assistant:

CURLMsg *curl_multi_info_read(struct Curl_multi *multi, int *msgs_in_queue)
{
  struct Curl_message *msg;

  *msgs_in_queue = 0; /* default to none */

  if(GOOD_MULTI_HANDLE(multi) &&
     !multi->in_callback &&
     Curl_llist_count(&multi->msglist)) {
    /* there is one or more messages in the list */
    struct Curl_llist_element *e;

    /* extract the head of the list to return */
    e = multi->msglist.head;

    msg = e->ptr;

    /* remove the extracted entry */
    Curl_llist_remove(&multi->msglist, e, NULL);

    *msgs_in_queue = curlx_uztosi(Curl_llist_count(&multi->msglist));

    return &msg->extmsg;
  }
  return NULL;
}